

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_font_query_font_glyph
               (nk_handle handle,float height,nk_user_font_glyph *glyph,nk_rune codepoint,
               nk_rune next_codepoint)

{
  nk_font_glyph *pnVar1;
  float fVar2;
  nk_vec2 nVar3;
  nk_font *font;
  nk_font_glyph *g;
  float scale;
  nk_rune next_codepoint_local;
  nk_rune codepoint_local;
  nk_user_font_glyph *glyph_local;
  float height_local;
  nk_handle handle_local;
  
  if (glyph == (nk_user_font_glyph *)0x0) {
    __assert_fail("glyph",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x287e,
                  "void nk_font_query_font_glyph(nk_handle, float, struct nk_user_font_glyph *, nk_rune, nk_rune)"
                 );
  }
  if (handle.ptr == (void *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2882,
                  "void nk_font_query_font_glyph(nk_handle, float, struct nk_user_font_glyph *, nk_rune, nk_rune)"
                 );
  }
  if (*(long *)((long)handle.ptr + 0x58) == 0) {
    __assert_fail("font->glyphs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2883,
                  "void nk_font_query_font_glyph(nk_handle, float, struct nk_user_font_glyph *, nk_rune, nk_rune)"
                 );
  }
  if ((handle.ptr != (void *)0x0) && (glyph != (nk_user_font_glyph *)0x0)) {
    fVar2 = height / *(float *)((long)handle.ptr + 0x30);
    pnVar1 = nk_font_find_glyph((nk_font *)handle.ptr,codepoint);
    glyph->width = (pnVar1->x1 - pnVar1->x0) * fVar2;
    glyph->height = (pnVar1->y1 - pnVar1->y0) * fVar2;
    nVar3 = nk_vec2(pnVar1->x0 * fVar2,pnVar1->y0 * fVar2);
    glyph->offset = nVar3;
    glyph->xadvance = pnVar1->xadvance * fVar2;
    nVar3 = nk_vec2(pnVar1->u0,pnVar1->v0);
    glyph->uv[0] = nVar3;
    nVar3 = nk_vec2(pnVar1->u1,pnVar1->v1);
    glyph->uv[1] = nVar3;
  }
  return;
}

Assistant:

NK_INTERN void
nk_font_query_font_glyph(nk_handle handle, float height,
    struct nk_user_font_glyph *glyph, nk_rune codepoint, nk_rune next_codepoint)
{
    float scale;
    const struct nk_font_glyph *g;
    struct nk_font *font;

    NK_ASSERT(glyph);
    NK_UNUSED(next_codepoint);

    font = (struct nk_font*)handle.ptr;
    NK_ASSERT(font);
    NK_ASSERT(font->glyphs);
    if (!font || !glyph)
        return;

    scale = height/font->info.height;
    g = nk_font_find_glyph(font, codepoint);
    glyph->width = (g->x1 - g->x0) * scale;
    glyph->height = (g->y1 - g->y0) * scale;
    glyph->offset = nk_vec2(g->x0 * scale, g->y0 * scale);
    glyph->xadvance = (g->xadvance * scale);
    glyph->uv[0] = nk_vec2(g->u0, g->v0);
    glyph->uv[1] = nk_vec2(g->u1, g->v1);
}